

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O0

GuessScore __thiscall
csv::internals::calculate_score(internals *this,string_view head,CSVFormat *format)

{
  initializer_list<std::pair<const_unsigned_long,_unsigned_long>_> __l;
  initializer_list<std::pair<const_unsigned_long,_unsigned_long>_> __l_00;
  GuessScore GVar1;
  CSVRow *pCVar2;
  __node_base_ptr format_00;
  bool bVar3;
  _Ios_Openmode _Var4;
  const_pointer __s;
  CSVRow *pCVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double score;
  unsigned_long row_count;
  unsigned_long row_size;
  pair<const_unsigned_long,_unsigned_long> *pair;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *__range2;
  size_t header_row;
  double final_score;
  size_t local_ae8;
  size_t local_ae0;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_ad8;
  size_t local_ad0;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> local_ac8;
  CSVRow *local_ac0;
  CSVRow *row;
  size_t i;
  undefined1 local_aa0 [8];
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  parser;
  RowCollection rows;
  string local_2b8 [32];
  stringstream local_298 [8];
  stringstream source;
  allocator<std::pair<const_unsigned_long,_unsigned_long>_> local_10b;
  key_equal local_10a;
  hasher local_109;
  int local_108 [2];
  pair<const_unsigned_long,_unsigned_long> local_100;
  iterator local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  row_when;
  allocator<std::pair<const_unsigned_long,_unsigned_long>_> local_93;
  key_equal local_92;
  hasher local_91;
  int local_90 [2];
  pair<const_unsigned_long,_unsigned_long> local_88;
  pair<const_unsigned_long,_unsigned_long> *local_78;
  size_type local_70;
  undefined1 local_68 [8];
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  row_tally;
  CSVFormat *format_local;
  string_view head_local;
  
  row_tally._M_h._M_single_bucket = (__node_base_ptr)head._M_str;
  head_local._M_len = head._M_len;
  local_90[1] = 0;
  local_90[0] = 0;
  format_local = (CSVFormat *)this;
  std::pair<const_unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_88,local_90 + 1,local_90);
  local_70 = 1;
  local_78 = &local_88;
  std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>::allocator(&local_93);
  __l_00._M_len = local_70;
  __l_00._M_array = local_78;
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   *)local_68,__l_00,0,&local_91,&local_92,&local_93);
  std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>::~allocator(&local_93);
  local_108[1] = 0;
  local_108[0] = 0;
  std::pair<const_unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_100,local_108 + 1,local_108);
  local_f0 = &local_100;
  local_e8 = 1;
  std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>::allocator(&local_10b);
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   *)local_e0,__l,0,&local_109,&local_10a,&local_10b);
  std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>::~allocator(&local_10b);
  __s = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&format_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b8,__s,
             (allocator<char> *)
             ((long)&rows.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 7));
  _Var4 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_298,local_2b8,_Var4);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rows.data.super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 7));
  ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque
            ((ThreadSafeDeque<csv::CSVRow> *)&parser.stream_pos,100);
  format_00 = row_tally._M_h._M_single_bucket;
  std::shared_ptr<csv::internals::ColNames>::shared_ptr
            ((shared_ptr<csv::internals::ColNames> *)&i,(nullptr_t)0x0);
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::StreamParser((StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_aa0,
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_298,(CSVFormat *)format_00,(shared_ptr<csv::internals::ColNames> *)&i);
  std::shared_ptr<csv::internals::ColNames>::~shared_ptr((shared_ptr<csv::internals::ColNames> *)&i)
  ;
  IBasicCSVParser::set_output((IBasicCSVParser *)local_aa0,(RowCollection *)&parser.stream_pos);
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::next((StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_aa0,10000000);
  for (row = (CSVRow *)0x0; pCVar2 = row,
      pCVar5 = (CSVRow *)
               ThreadSafeDeque<csv::CSVRow>::size
                         ((ThreadSafeDeque<csv::CSVRow> *)&parser.stream_pos), pCVar2 < pCVar5;
      row = (CSVRow *)
            ((long)&(row->data).
                    super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr + 1)) {
    local_ac0 = ThreadSafeDeque<csv::CSVRow>::operator[]
                          ((ThreadSafeDeque<csv::CSVRow> *)&parser.stream_pos,(size_t)row);
    sVar6 = CSVRow::size(local_ac0);
    if (sVar6 != 0) {
      local_ad0 = CSVRow::size(local_ac0);
      local_ac8._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::find((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                   *)local_68,&local_ad0);
      local_ad8._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::end((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  *)local_68);
      bVar3 = std::__detail::operator!=(&local_ac8,&local_ad8);
      if (bVar3) {
        local_ae0 = CSVRow::size(local_ac0);
        pmVar7 = std::
                 unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                               *)local_68,&local_ae0);
        *pmVar7 = *pmVar7 + 1;
      }
      else {
        local_ae8 = CSVRow::size(local_ac0);
        pmVar7 = std::
                 unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                               *)local_68,&local_ae8);
        pCVar2 = row;
        *pmVar7 = 1;
        final_score = (double)CSVRow::size(local_ac0);
        pmVar7 = std::
                 unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                 ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                               *)local_e0,(key_type *)&final_score);
        *pmVar7 = (mapped_type)pCVar2;
      }
    }
  }
  header_row = 0;
  __range2 = (unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)0x0;
  __end2 = std::
           unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::begin((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    *)local_68);
  pair = (pair<const_unsigned_long,_unsigned_long> *)
         std::
         unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         ::end((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                *)local_68);
  while (bVar3 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                              *)&pair), bVar3) {
    row_size = (unsigned_long)
               std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::
               operator*(&__end2);
    row_count = ((reference)row_size)->first;
    lVar8 = row_count * ((reference)row_size)->second;
    auVar10._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar10._0_8_ = lVar8;
    auVar10._12_4_ = 0x45300000;
    dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    if ((double)header_row < dVar9) {
      pmVar7 = std::
               unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
               ::operator[]((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                             *)local_e0,&row_count);
      __range2 = (unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                  *)*pmVar7;
      header_row = (size_t)dVar9;
    }
    std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::
    operator++(&__end2);
  }
  head_local._M_str = (char *)header_row;
  StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~StreamParser((StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_aa0);
  ThreadSafeDeque<csv::CSVRow>::~ThreadSafeDeque((ThreadSafeDeque<csv::CSVRow> *)&parser.stream_pos)
  ;
  std::__cxx11::stringstream::~stringstream(local_298);
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    *)local_e0);
  std::
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~unordered_map((unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                    *)local_68);
  GVar1.header = (size_t)__range2;
  GVar1.score = (double)head_local._M_str;
  return GVar1;
}

Assistant:

CSV_INLINE GuessScore calculate_score(csv::string_view head, const CSVFormat& format) {
            // Frequency counter of row length
            std::unordered_map<size_t, size_t> row_tally = { { 0, 0 } };

            // Map row lengths to row num where they first occurred
            std::unordered_map<size_t, size_t> row_when = { { 0, 0 } };

            // Parse the CSV
            std::stringstream source(head.data());
            RowCollection rows;

            StreamParser<std::stringstream> parser(source, format);
            parser.set_output(rows);
            parser.next();

            for (size_t i = 0; i < rows.size(); i++) {
                auto& row = rows[i];

                // Ignore zero-length rows
                if (row.size() > 0) {
                    if (row_tally.find(row.size()) != row_tally.end()) {
                        row_tally[row.size()]++;
                    }
                    else {
                        row_tally[row.size()] = 1;
                        row_when[row.size()] = i;
                    }
                }
            }

            double final_score = 0;
            size_t header_row = 0;

            // Final score is equal to the largest
            // row size times rows of that size
            for (auto& pair : row_tally) {
                auto row_size = pair.first;
                auto row_count = pair.second;
                double score = (double)(row_size * row_count);
                if (score > final_score) {
                    final_score = score;
                    header_row = row_when[row_size];
                }
            }

            return {
                final_score,
                header_row
            };
        }